

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall
TestCharReaderTestparseWithOneError::runTestCase(TestCharReaderTestparseWithOneError *this)

{
  bool bVar1;
  int iVar2;
  CharReader *pCVar3;
  string errs;
  Value root;
  char doc [26];
  CharReaderBuilder b;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  Value local_90;
  char local_68 [40];
  CharReaderBuilder local_40;
  
  Json::CharReaderBuilder::CharReaderBuilder(&local_40);
  pCVar3 = Json::CharReaderBuilder::newCharReader(&local_40);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  local_b0._M_string_length = 0;
  local_b0.field_2._M_local_buf[0] = '\0';
  Json::Value::Value(&local_90,nullValue);
  builtin_strncpy(local_68 + 0x10,"\"value\" }",10);
  builtin_strncpy(local_68,"{ \"property\" :: ",0x10);
  iVar2 = (*pCVar3->_vptr_CharReader[2])(pCVar3,local_68,local_68 + 0x19,&local_90,&local_b0);
  if ((char)iVar2 != '\0') {
    JsonTest::TestResult::addFailure
              ((this->super_CharReaderTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x74d,"!ok");
  }
  bVar1 = std::operator==(&local_b0,
                          "* Line 1, Column 15\n  Syntax error: value, object or array expected.\n")
  ;
  if (!bVar1) {
    JsonTest::TestResult::addFailure
              ((this->super_CharReaderTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x750,
               "errs == \"* Line 1, Column 15\\n  Syntax error: value, object or array \" \"expected.\\n\""
              );
  }
  (*pCVar3->_vptr_CharReader[1])(pCVar3);
  Json::Value::~Value(&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  Json::CharReaderBuilder::~CharReaderBuilder(&local_40);
  return;
}

Assistant:

JSONTEST_FIXTURE(CharReaderTest, parseWithOneError) {
  Json::CharReaderBuilder b;
  Json::CharReader* reader(b.newCharReader());
  std::string errs;
  Json::Value root;
  char const doc[] =
      "{ \"property\" :: \"value\" }";
  bool ok = reader->parse(
      doc, doc + std::strlen(doc),
      &root, &errs);
  JSONTEST_ASSERT(!ok);
  JSONTEST_ASSERT(errs ==
                  "* Line 1, Column 15\n  Syntax error: value, object or array "
                  "expected.\n");
  delete reader;
}